

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O1

bool __thiscall
llama_context::state_load_file
          (llama_context *this,char *filepath,llama_token *tokens_out,size_t n_token_capacity,
          size_t *n_token_count_out)

{
  uint32_t uVar1;
  uint32_t uVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  bool bVar7;
  llama_file file;
  llama_io_read_file io;
  llama_file lStack_68;
  llama_io_read_i local_60;
  undefined1 *local_58;
  undefined8 local_50;
  void *pvStack_48;
  undefined8 local_40;
  long lStack_38;
  
  llama_file::llama_file(&lStack_68,filepath,"rb");
  uVar1 = llama_file::read_u32(&lStack_68);
  uVar2 = llama_file::read_u32(&lStack_68);
  if (uVar2 == 9 && uVar1 == 0x6767736e) {
    uVar1 = llama_file::read_u32(&lStack_68);
    uVar6 = (ulong)uVar1;
    if (n_token_capacity < uVar6) {
      llama_log_internal(GGML_LOG_LEVEL_ERROR,
                         "%s: token count in session file exceeded capacity! %u > %zu\n",
                         "state_load_file",(ulong)uVar1,n_token_capacity);
      bVar7 = false;
    }
    else {
      llama_file::read_raw(&lStack_68,tokens_out,uVar6 * 4);
      *n_token_count_out = uVar6;
      sVar3 = llama_file::size(&lStack_68);
      sVar4 = llama_file::tell(&lStack_68);
      local_60._vptr_llama_io_read_i = (_func_int **)&PTR__llama_io_read_file_00286550;
      local_50 = 0;
      pvStack_48 = (void *)0x0;
      local_40 = 0;
      lStack_38 = 0;
      local_58 = (undefined1 *)&lStack_68;
      sVar5 = state_read_data(this,&local_60);
      bVar7 = sVar5 == sVar3 - sVar4;
      if (!bVar7) {
        llama_log_internal(GGML_LOG_LEVEL_ERROR,
                           "%s: did not read all of the session file data! size %zu, got %zu\n",
                           "state_load_file",sVar3 - sVar4,sVar5);
      }
      local_60._vptr_llama_io_read_i = (_func_int **)&PTR__llama_io_read_file_00286550;
      if (pvStack_48 != (void *)0x0) {
        operator_delete(pvStack_48,lStack_38 - (long)pvStack_48);
      }
    }
  }
  else {
    bVar7 = false;
    llama_log_internal(GGML_LOG_LEVEL_ERROR,
                       "%s: unknown (magic, version) for session file: %08x, %08x\n",
                       "state_load_file",(ulong)uVar1,(ulong)uVar2);
  }
  llama_file::~llama_file(&lStack_68);
  return bVar7;
}

Assistant:

bool llama_context::state_load_file(const char * filepath, llama_token * tokens_out, size_t n_token_capacity, size_t * n_token_count_out) {
    llama_file file(filepath, "rb");

    // sanity checks
    {
        const uint32_t magic   = file.read_u32();
        const uint32_t version = file.read_u32();

        if (magic != LLAMA_SESSION_MAGIC || version != LLAMA_SESSION_VERSION) {
            LLAMA_LOG_ERROR("%s: unknown (magic, version) for session file: %08x, %08x\n", __func__, magic, version);
            return false;
        }
    }

    // load the prompt
    {
        const uint32_t n_token_count = file.read_u32();

        if (n_token_count > n_token_capacity) {
            LLAMA_LOG_ERROR("%s: token count in session file exceeded capacity! %u > %zu\n", __func__, n_token_count, n_token_capacity);
            return false;
        }

        file.read_raw(tokens_out, sizeof(llama_token) * n_token_count);
        *n_token_count_out = n_token_count;
    }

    // restore the context state
    {
        const size_t n_state_size_cur = file.size() - file.tell();

        llama_io_read_file io( &file);
        const size_t n_read = state_read_data(io);

        if (n_read != n_state_size_cur) {
            LLAMA_LOG_ERROR("%s: did not read all of the session file data! size %zu, got %zu\n", __func__, n_state_size_cur, n_read);
            return false;
        }
    }

    return true;
}